

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

size_t n_occurences_s(int *array,size_t length,int needle)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (length == 0) {
    return 0;
  }
  sVar3 = 0;
  sVar2 = 0;
  do {
    iVar1 = array[sVar3];
    if (iVar1 != needle && needle <= iVar1) {
      return sVar2;
    }
    sVar2 = sVar2 + (iVar1 == needle);
    sVar3 = sVar3 + 1;
  } while (length != sVar3);
  return sVar2;
}

Assistant:

size_t n_occurences_s(const int* array, const size_t length, const int needle) {
  size_t sum = 0;
  for (size_t i = 0; i < length && array[i] <= needle; i++) {
    if (array[i] == needle) {
      sum++;
    }
  }
  return sum;
}